

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc_wrapper.cpp
# Opt level: O0

size_t duckdb::Utf8Proc::GraphemeCount(char *input_data,size_t input_size)

{
  bool bVar1;
  GraphemeCluster GVar2;
  GraphemeCluster cluster;
  GraphemeClusterIterator __end1;
  GraphemeClusterIterator __begin1;
  GraphemeIterator *__range1;
  size_t num_characters;
  size_t in_stack_ffffffffffffff78;
  GraphemeIterator *in_stack_ffffffffffffff80;
  GraphemeClusterIterator *in_stack_ffffffffffffff98;
  GraphemeClusterIterator local_50;
  GraphemeIterator local_30;
  GraphemeIterator *local_20;
  size_t local_18;
  
  local_18 = 0;
  local_30 = GraphemeClusters((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_20 = &local_30;
  GraphemeIterator::begin(in_stack_ffffffffffffff80);
  GraphemeIterator::end(in_stack_ffffffffffffff80);
  while( true ) {
    bVar1 = GraphemeIterator::GraphemeClusterIterator::operator!=
                      (&local_50,(GraphemeClusterIterator *)&stack0xffffffffffffff90);
    if (!bVar1) break;
    GVar2 = GraphemeIterator::GraphemeClusterIterator::operator*(in_stack_ffffffffffffff98);
    local_18 = local_18 + 1;
    GraphemeIterator::GraphemeClusterIterator::operator++((GraphemeClusterIterator *)GVar2.start);
  }
  return local_18;
}

Assistant:

size_t Utf8Proc::GraphemeCount(const char *input_data, size_t input_size) {
	size_t num_characters = 0;
	for (auto cluster : Utf8Proc::GraphemeClusters(input_data, input_size)) {
		(void)cluster;
		num_characters++;
	}
	return num_characters;
}